

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcInse.c
# Opt level: O0

Vec_Int_t *
Gia_ManInseTest(Gia_Man_t *p,Vec_Int_t *vInit0,int nFrames,int nWords,int nTimeOut,int fSim,
               int fVerbose)

{
  int nSize;
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar1;
  Vec_Int_t *vInit;
  Vec_Int_t *vRes;
  int fSim_local;
  int nTimeOut_local;
  int nWords_local;
  int nFrames_local;
  Vec_Int_t *vInit0_local;
  Gia_Man_t *p_local;
  
  p_00 = Vec_IntAlloc(0);
  nSize = Gia_ManRegNum(p);
  Vec_IntFill(p_00,nSize,0);
  pVVar1 = Gia_ManInsePerform(p,p_00,nFrames,nWords,fVerbose);
  if (p_00 != vInit0) {
    Vec_IntFree(p_00);
  }
  return pVVar1;
}

Assistant:

Vec_Int_t * Gia_ManInseTest( Gia_Man_t * p, Vec_Int_t * vInit0, int nFrames, int nWords, int nTimeOut, int fSim, int fVerbose )
{
    Vec_Int_t * vRes, * vInit;
    vInit = Vec_IntAlloc(0); Vec_IntFill( vInit, Gia_ManRegNum(p), 0 );
    vRes = Gia_ManInsePerform( p, vInit, nFrames, nWords, fVerbose );
    if ( vInit != vInit0 )
        Vec_IntFree( vInit );
    return vRes;
}